

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<true>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  Type *pTVar1;
  ushort uVar2;
  JavascriptLibrary *pJVar3;
  Recycler *pRVar4;
  PathTypeSuccessorInfo *this_00;
  Data *pDVar5;
  RecyclerWeakReference<Js::DynamicObject> *pRVar6;
  DynamicType *pDVar7;
  code *pcVar8;
  undefined1 auVar9 [8];
  RecyclerWeakReference<Js::DynamicType> *pRVar10;
  uint8 oldPathSize;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  PropertyTypes PVar14;
  PropertyIndex PVar15;
  int iVar16;
  PropertyId propertyId;
  undefined4 *puVar17;
  undefined4 extraout_var_00;
  PathTypeSetterSlotIndex *oldSetters;
  TypePath *pTVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PathTypeHandlerBase *pPVar19;
  undefined6 extraout_var;
  PathTypeHandlerWithAttr *pPVar20;
  Recycler *alloc;
  PathTypeHandlerWithAttr *pPVar21;
  RecyclerWeakReferenceBase *weakRef;
  byte bVar22;
  undefined7 in_register_00000009;
  TypePath *pTVar23;
  uint uVar24;
  char16_t *this_01;
  PathTypeHandlerBase *this_02;
  char *instance_00;
  char cVar25;
  char cVar26;
  ushort uVar27;
  uint uVar28;
  ScriptContext *pSVar29;
  bool bVar30;
  undefined1 local_e8 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::DynamicType> *local_b0;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  Recycler *local_a0;
  DynamicType *local_98;
  ulong local_90;
  undefined4 local_84;
  PropertyRecord *local_80;
  ScriptContext *local_78;
  TypePath *local_70;
  uint local_64;
  DynamicObject *local_60;
  PathTypeHandlerBase *local_58;
  undefined8 local_50;
  PathTypeSetterSlotIndex *local_48;
  uint16 local_3a;
  PathTypeHandlerWithAttr *local_38;
  undefined4 extraout_var_01;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,shareType);
  nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)key;
  local_98 = predecessorType;
  local_60 = instance;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar11) goto LAB_00dc8950;
    *puVar17 = 0;
  }
  pRVar10 = nextTypeWeakRef;
  local_90 = (ulong)nextTypeWeakRef >> 0x20;
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pRVar4 = scriptContext->recycler;
  local_b0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  local_78 = scriptContext;
  local_80 = ScriptContext::GetPropertyName(scriptContext,(PropertyId)nextTypeWeakRef);
  this_00 = (this->successorInfo).ptr;
  if (this_00 == (PathTypeSuccessorInfo *)0x0) {
    local_b0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
LAB_00dc7dc7:
    local_70 = (this->typePath).ptr;
    local_48 = (PathTypeSetterSlotIndex *)CONCAT71(local_48._1_7_,((local_70->data).ptr)->pathSize);
    local_a0 = pRVar4;
    iVar16 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    local_38 = (PathTypeHandlerWithAttr *)CONCAT44(extraout_var_00,iVar16);
    iVar16 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_01,iVar16);
    pDVar5 = (((this->typePath).ptr)->data).ptr;
    bVar12 = pDVar5->pathLength;
    uVar27 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar27 < bVar12) {
      this_01 = L"branching";
      local_50 = (PathTypeHandlerWithAttr *)((ulong)local_50._4_4_ << 0x20);
    }
    else {
      local_50 = (PathTypeHandlerWithAttr *)
                 CONCAT44(local_50._4_4_,
                          (int)CONCAT71((int7)((ulong)pDVar5 >> 8),bVar12 == pDVar5->pathSize));
      this_01 = L"advancing";
    }
    local_58 = this;
    bVar11 = HasSingletonInstance(this);
    if (bVar11) {
      data._32_8_ = (((this->typePath).ptr)->singletonInstance).ptr;
    }
    else {
      data._32_8_ = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_01,L"PathTypeHandler",L"PathTypeHandler",local_60,
               &this->super_DynamicTypeHandler,local_98,
               (RecyclerWeakReference<Js::DynamicObject> *)data._32_8_);
    pPVar20 = local_38;
    pPVar19 = local_58;
    pRVar4 = local_a0;
    cVar25 = (char)local_90;
    if (uVar27 < bVar12) {
      uVar24 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar11 = (bool)((DAT_015bf345 ^ 1) & ((this->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar19 = (PathTypeHandlerBase *)(this->typePath).ptr;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
        pTVar18 = TypePath::Branch<false>
                            ((TypePath *)pPVar19,local_a0,uVar24,bVar11,(ObjectSlotAttributes *)0x0)
        ;
        pPVar20 = local_38;
      }
      else {
        pTVar18 = TypePath::Branch<true>
                            ((TypePath *)pPVar19,local_a0,uVar24,bVar11,
                             (ObjectSlotAttributes *)local_38);
      }
      local_78->branchCount = local_78->branchCount + 1;
      local_78->objectLiteralBranchCount = local_78->objectLiteralBranchCount + 1;
      if (cVar25 == '\a' && pPVar20 == (PathTypeHandlerWithAttr *)0x0) {
        local_50 = (PathTypeHandlerWithAttr *)0x0;
      }
      else {
        local_50 = (PathTypeHandlerWithAttr *)
                   UpdateAttributes(pPVar19,pRVar4,(ObjectSlotAttributes *)pPVar20,(uint8)local_48,
                                    ((pTVar18->data).ptr)->pathSize);
      }
      pPVar19 = local_58;
      if (cVar25 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_48 = UpdateSetterSlots(local_58,pRVar4,oldSetters,(uint8)local_48,
                                     ((pTVar18->data).ptr)->pathSize);
      }
      else {
        local_48 = (PathTypeSetterSlotIndex *)0x0;
      }
      oldSetters = local_48;
      if (DAT_015bf361 == 1) {
        bVar11 = DynamicTypeHandler::ShouldFixAnyProperties();
        pTVar23 = (pPVar19->typePath).ptr;
        if ((!bVar11) &&
           ((pTVar23->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar17 = 1;
          bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                       ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                       "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar11) goto LAB_00dc8950;
          *puVar17 = 0;
          pTVar23 = (local_58->typePath).ptr;
          pPVar19 = local_58;
        }
        pRVar6 = (pTVar23->singletonInstance).ptr;
        oldSetters = local_48;
        if ((pRVar6 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar6->super_RecyclerWeakReferenceBase).strongRef == local_60)) {
          (pTVar23->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
LAB_00dc824a:
      local_48 = oldSetters;
      if (cVar25 == -9) goto LAB_00dc8250;
      local_70 = pTVar18;
      iVar16 = TypePath::AddInternal<true>(pTVar18,local_80);
      local_60 = (DynamicObject *)CONCAT44(local_60._4_4_,iVar16);
      cVar25 = '\0';
    }
    else {
      if ((char)local_50 != '\0') {
        this_02 = (PathTypeHandlerBase *)(local_58->typePath).ptr;
        pTVar18 = TypePath::Grow((TypePath *)this_02,local_a0);
        if (cVar25 == '\a' && local_38 == (PathTypeHandlerWithAttr *)0x0) {
          local_50 = (PathTypeHandlerWithAttr *)0x0;
        }
        else {
          local_50 = (PathTypeHandlerWithAttr *)
                     UpdateAttributes(this_02,pRVar4,(ObjectSlotAttributes *)local_38,
                                      (uint8)local_48,((pTVar18->data).ptr)->pathSize);
        }
        if (cVar25 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
          local_48 = UpdateSetterSlots(pPVar19,pRVar4,oldSetters,(uint8)local_48,
                                       ((pTVar18->data).ptr)->pathSize);
        }
        else {
          local_48 = (PathTypeSetterSlotIndex *)0x0;
        }
        pTVar23 = (pPVar19->typePath).ptr;
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          (*(pPVar19->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar19,pTVar18);
          if ((local_38 != (PathTypeHandlerWithAttr *)0x0) &&
             (iVar16 = (*(pPVar19->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])
                                 (pPVar19),
             (PathTypeHandlerWithAttr *)CONCAT44(extraout_var_02,iVar16) == local_38)) {
            (*(pPVar19->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar19,local_50);
          }
          if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
             (iVar16 = (*(pPVar19->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])
                                 (pPVar19),
             (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_03,iVar16) == oldSetters)) {
            (*(pPVar19->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar19,local_48);
          }
          pDVar7 = (pPVar19->predecessorType).ptr;
          if (pDVar7 == (DynamicType *)0x0) break;
          iVar16 = (*((pDVar7->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar16 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar17 = 1;
            bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                         ,0x844,
                                         "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                         ,
                                         "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                        );
            if (!bVar11) goto LAB_00dc8950;
            *puVar17 = 0;
          }
          pPVar19 = FromTypeHandler((pDVar7->typeHandler).ptr);
        } while ((pPVar19->typePath).ptr == pTVar23);
        cVar25 = (char)local_90;
        pPVar19 = local_58;
        oldSetters = local_48;
        goto LAB_00dc824a;
      }
      oldPathSize = (uint8)local_48;
      local_50 = local_38;
      if (local_38 == (PathTypeHandlerWithAttr *)0x0 && cVar25 != '\a') {
        local_50 = (PathTypeHandlerWithAttr *)
                   UpdateAttributes((PathTypeHandlerBase *)this_01,local_a0,
                                    (ObjectSlotAttributes *)0x0,(uint8)local_48,
                                    ((local_70->data).ptr)->pathSize);
      }
      pTVar18 = local_70;
      if (oldSetters != (PathTypeSetterSlotIndex *)0x0 || cVar25 != -9) goto LAB_00dc824a;
      local_48 = UpdateSetterSlots(pPVar19,pRVar4,(PathTypeSetterSlotIndex *)0x0,oldPathSize,
                                   ((local_70->data).ptr)->pathSize);
LAB_00dc8250:
      local_70 = pTVar18;
      iVar16 = TypePath::AddInternal<false>(pTVar18,local_80);
      local_60 = (DynamicObject *)CONCAT44(local_60._4_4_,iVar16);
      cVar25 = '\x01';
    }
    uVar28 = ((pPVar19->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar24 = (pPVar19->super_DynamicTypeHandler).slotCapacity;
    uVar27 = (ushort)uVar28;
    if (uVar27 <= (ushort)uVar24) {
      uVar28 = uVar24;
    }
    uVar2 = (pPVar19->super_DynamicTypeHandler).inlineSlotCapacity;
    local_3a = (pPVar19->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar11 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler
                       (&pPVar19->super_DynamicTypeHandler);
    local_64 = (uint)uVar2;
    if ((bVar11) && ((pPVar19->super_DynamicTypeHandler).slotCapacity < (int)(uVar28 & 0xffff))) {
      PVar15 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_64 = local_64 - (int)CONCAT62(extraout_var,PVar15);
      local_3a = 0x20;
    }
    pSVar29 = local_78;
    bVar11 = (bool)(DAT_015bf361 ^ 1 | (byte)local_84);
    cVar26 = (char)local_90;
    bVar30 = local_38 == (PathTypeHandlerWithAttr *)0x0;
    local_38 = (PathTypeHandlerWithAttr *)(ulong)bVar11;
    if (bVar30 && cVar26 == '\a') {
      pPVar20 = (PathTypeHandlerWithAttr *)
                PathTypeHandlerNoAttr::New
                          (local_78,local_70,uVar27,(PropertyIndex)uVar28,(uint16)local_64,local_3a,
                           true,bVar11,local_98);
    }
    else {
      iVar16 = (*(local_58->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      pSVar29 = local_78;
      *(char *)((long)&(local_50->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                       super_DynamicTypeHandler._vptr_DynamicTypeHandler +
               ((ulong)local_60 & 0xffff)) = cVar26;
      pPVar20 = PathTypeHandlerWithAttr::New
                          (local_78,local_70,(ObjectSlotAttributes *)local_50,local_48,
                           (char)iVar16 + cVar25,uVar27,(PropertyIndex)uVar28,(uint16)local_64,
                           local_3a,true,SUB81(local_38,0),local_98);
    }
    if (bVar11 == false) {
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pPVar20,'\b');
    }
    bVar12 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)pPVar20);
    this = local_58;
    if ((bVar12 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar11) goto LAB_00dc8950;
      *puVar17 = 0;
    }
    PVar14 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)pPVar20,0xb0,PVar14);
    PVar14 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pPVar20,'@',PVar14);
    pRVar10 = nextTypeWeakRef;
    if ((byte)local_84 != '\0') {
      AddBlankFieldAt((PathTypeHandlerBase *)pPVar20,local_80->pid,(PropertyIndex)local_60,pSVar29);
    }
    pRVar4 = local_a0;
    if ((uint)pRVar10 == 0x67) {
      (pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    else if ((uint)pRVar10 < 0x10) {
      (pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar16 = ((this->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar16 < pSVar29->maxPathLength) {
      iVar16 = pSVar29->maxPathLength;
    }
    pSVar29->maxPathLength = iVar16;
    local_e8 = (undefined1  [8])&DynamicType::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9d226db;
    data.filename._0_4_ = 0x89a;
    alloc = Memory::Recycler::TrackAllocInfo(local_a0,(TrackAllocData *)local_e8);
    pPVar21 = (PathTypeHandlerWithAttr *)new<Memory::Recycler>(0x38,alloc,0x387914);
    pDVar7 = local_98;
    DynamicType::DynamicType
              ((DynamicType *)pPVar21,local_98,(DynamicTypeHandler *)pPVar20,true,SUB81(local_38,0))
    ;
    local_50 = pPVar21;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&pRVar4->weakReferenceMap,(char *)pPVar21,pRVar4);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&DynamicType::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(pRVar4,weakRef);
    }
    instance_00 = (char *)this;
    SetSuccessor(this,pDVar7,(PathTypeSuccessorKey)nextTypeWeakRef,
                 (RecyclerWeakReference<Js::DynamicType> *)weakRef,local_78);
    pTVar18 = local_70;
    local_38 = pPVar20;
    if ((pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)((local_70->data).ptr)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8aa,
                                   "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                   "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar11) goto LAB_00dc8950;
      *puVar17 = 0;
    }
    pPVar20 = local_50;
    if ((DAT_015bf361 == 1 && (byte)local_84 == '\0') &&
       ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)((pTVar18->data).ptr)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8ac,
                                   "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                   ,
                                   "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                  );
      if (!bVar11) goto LAB_00dc8950;
      *puVar17 = 0;
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)instance_00,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)local_38,pDVar7,(DynamicType *)pPVar20,
               (RecyclerWeakReference<Js::DynamicObject> *)data._32_8_);
    local_78->promoteCount = local_78->promoteCount + 1;
    local_78->objectLiteralPromoteCount = local_78->objectLiteralPromoteCount + 1;
  }
  else {
    bVar11 = PathTypeSuccessorInfo::GetSuccessor(this_00,(PathTypeSuccessorKey)pRVar10,&local_b0);
    if ((!bVar11) ||
       (pPVar20 = (PathTypeHandlerWithAttr *)(local_b0->super_RecyclerWeakReferenceBase).strongRef,
       pPVar20 == (PathTypeHandlerWithAttr *)0x0)) goto LAB_00dc7dc7;
    local_78->cacheCount = local_78->cacheCount + 1;
    local_38 = (PathTypeHandlerWithAttr *)
               (pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.successorInfo.ptr;
    if (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 != ((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c3,
                                   "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                   ,
                                   "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                  );
      if (!bVar11) goto LAB_00dc8950;
      *puVar17 = 0;
    }
    pPVar21 = local_38;
    iVar16 = (*(local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
               super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(local_38,local_80);
    local_60 = (DynamicObject *)CONCAT44(local_60._4_4_,iVar16);
    bVar12 = (pPVar21->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
             super_DynamicTypeHandler.flags;
    if (((DAT_015bf361 != 1) || ((bVar12 & 8) == 0)) &&
       (((bVar12 & 0x10) == 0 ||
        ((pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty ==
         false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c8,
                                   "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                   ,
                                   "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                  );
      if (!bVar11) goto LAB_00dc8950;
      *puVar17 = 0;
    }
    pPVar21 = local_38;
    pSVar29 = local_78;
    if (((DAT_015bf361 & 1) != 0) &&
       ((pPVar20->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty ==
        false)) {
      if (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
           super_DynamicTypeHandler.flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)local_38,local_80->pid,(PropertyIndex)local_60,
                        local_78);
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)pPVar21,pSVar29);
      }
      DynamicType::ShareType((DynamicType *)pPVar20);
    }
  }
  if ((DAT_015bf345 == 1) &&
     (bVar12 = (this->super_DynamicTypeHandler).flags, (bVar12 & 0x20) != 0 && (bVar12 & 0x18) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d5,
                                 "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                 ,
                                 "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                                );
    if (!bVar11) goto LAB_00dc8950;
    *puVar17 = 0;
  }
  pPVar21 = local_38;
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)local_38,(this->super_DynamicTypeHandler).flags & 0x20);
  bVar12 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar13 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)pPVar21);
  bVar22 = (byte)local_90 & 0x14;
  if ((bVar22 == 4 & (bVar13 ^ bVar12) >> 4) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d7,
                                 "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                 ,
                                 "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                                );
    if (!bVar11) goto LAB_00dc8950;
    *puVar17 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d8,
                                 "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                 ,
                                 "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                                );
    if (!bVar11) goto LAB_00dc8950;
    *puVar17 = 0;
  }
  PVar14 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)local_38,0xa0,PVar14);
  Memory::Recycler::WBSetBit(local_e8);
  local_e8 = (undefined1  [8])&pJVar3->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_e8);
  pPVar21 = local_38;
  auVar9 = local_e8;
  if ((bVar22 != 4) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)local_38,false),
     pSVar29 = local_78,
     ((pPVar21->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_78,local_80);
    ScriptContext::InvalidateStoreFieldCaches(pSVar29,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)auVar9);
  }
  Memory::Recycler::WBSetBit(local_e8);
  local_e8 = (undefined1  [8])&pJVar3->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_e8);
  auVar9 = local_e8;
  bVar11 = NoSpecialPropertyCache::IsSpecialProperty(local_80);
  if ((bVar11) &&
     (pTVar1 = &(local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                super_DynamicTypeHandler.propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
              ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)auVar9);
  }
  *propertyIndex = (PropertyIndex)local_60;
  if ((PathTypeHandlerBase *)
      (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)"
                                 ,"Promoting this type to a successor with a different predecessor?"
                                );
    if (!bVar11) {
LAB_00dc8950:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar17 = 0;
  }
  return (DynamicType *)pPVar20;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }